

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# std.cpp
# Opt level: O1

size_t t3vsprintf(char *buf,size_t buflen,char *fmt,__va_list_tag *args0)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  byte bVar5;
  void *pvVar6;
  bool bVar7;
  uint uVar8;
  ulong uVar9;
  uint *puVar10;
  uint uVar11;
  size_t sVar12;
  long lVar13;
  ulong uVar14;
  int iVar15;
  undefined8 uVar16;
  size_t sVar17;
  int iVar18;
  char *pcVar19;
  byte *pbVar20;
  byte *pbVar21;
  va_list args;
  char buf_1 [20];
  uint local_78;
  uint *puStack_70;
  byte local_58 [24];
  ulong local_40;
  ulong local_38;
  
  pvVar6 = args0->reg_save_area;
  local_78 = args0->gp_offset;
  puStack_70 = (uint *)args0->overflow_arg_area;
  sVar17 = 0;
  do {
    bVar1 = *fmt;
    if (bVar1 == 0x25) {
      bVar1 = ((byte *)fmt)[1];
      pbVar21 = (byte *)fmt + 1;
      if (bVar1 == 0x7e) {
        pbVar21 = (byte *)fmt + 2;
      }
      bVar2 = ((byte *)fmt)[(ulong)(bVar1 == 0x7e) + 1];
      uVar9 = (ulong)(bVar2 == 0x2b);
      bVar3 = pbVar21[uVar9];
      pbVar20 = pbVar21 + (bVar3 == 0x2d) + uVar9;
      bVar4 = pbVar21[(bVar3 == 0x2d) + uVar9];
      if ((int)(char)bVar4 - 0x3aU < 0xfffffff6) {
        local_40 = 0xffffffff;
        if (bVar4 == 0x2a) {
          uVar9 = (ulong)local_78;
          if (uVar9 < 0x29) {
            local_78 = local_78 + 8;
            puVar10 = (uint *)(uVar9 + (long)pvVar6);
          }
          else {
            puVar10 = puStack_70;
            puStack_70 = puStack_70 + 2;
          }
          local_40 = (ulong)*puVar10;
          pbVar20 = pbVar20 + 1;
        }
      }
      else {
        uVar11 = (int)(char)*pbVar20 - 0x30;
        local_40 = 0;
        if (uVar11 < 10) {
          local_40 = 0;
          do {
            local_40 = (ulong)(uVar11 + (int)local_40 * 10);
            pbVar21 = pbVar20 + 1;
            pbVar20 = pbVar20 + 1;
            uVar11 = (int)(char)*pbVar21 - 0x30;
          } while (uVar11 < 10);
        }
      }
      uVar11 = 0xffffffff;
      if (*pbVar20 == 0x2e) {
        if (pbVar20[1] == 0x2a) {
          uVar9 = (ulong)local_78;
          if (uVar9 < 0x29) {
            local_78 = local_78 + 8;
            puVar10 = (uint *)(uVar9 + (long)pvVar6);
          }
          else {
            puVar10 = puStack_70;
            puStack_70 = puStack_70 + 2;
          }
          uVar11 = *puVar10;
          pbVar20 = pbVar20 + 2;
        }
        else {
          pbVar20 = pbVar20 + 1;
          uVar8 = (int)(char)*pbVar20 - 0x30;
          uVar11 = 0;
          if (uVar8 < 10) {
            uVar11 = 0;
            do {
              uVar11 = uVar8 + uVar11 * 10;
              pbVar21 = pbVar20 + 1;
              pbVar20 = pbVar20 + 1;
              uVar8 = (int)(char)*pbVar21 - 0x30;
            } while (uVar8 < 10);
          }
        }
      }
      bVar5 = *pbVar20;
      bVar7 = false;
      uVar9 = 1;
      pbVar21 = (byte *)fmt;
      if (bVar5 < 100) {
        pbVar21 = pbVar20;
        if (bVar5 != 0x25) {
          if (bVar5 == 0x50) {
            uVar9 = (ulong)local_78;
            if (uVar9 < 0x29) {
              local_78 = local_78 + 8;
              puVar10 = (uint *)(uVar9 + (long)pvVar6);
            }
            else {
              puVar10 = puStack_70;
              puStack_70 = puStack_70 + 2;
            }
            pcVar19 = *(char **)puVar10;
            if ((byte *)pcVar19 == (byte *)0x0) {
              pcVar19 = "";
            }
            if ((int)uVar11 < 0) {
              sVar12 = strlen(pcVar19);
            }
            else {
              sVar12 = (size_t)uVar11;
            }
            for (; sVar12 != 0; sVar12 = sVar12 - 1) {
              uVar11 = (byte)*pcVar19 - 0x20;
              if ((uVar11 < 0x3e) && ((0x28000001ac009fdbU >> ((ulong)uVar11 & 0x3f) & 1) != 0)) {
                sprintf((char *)local_58,"%%%02x");
                lVar13 = 0;
                do {
                  if (1 < buflen) {
                    *buf = local_58[lVar13];
                    buf = (char *)((byte *)buf + 1);
                    buflen = buflen - 1;
                  }
                  lVar13 = lVar13 + 1;
                } while (lVar13 != 3);
                sVar17 = sVar17 + 3;
              }
              else {
                sVar17 = sVar17 + 1;
                if (1 < buflen) {
                  *buf = *pcVar19;
                  buf = (char *)((byte *)buf + 1);
                  buflen = buflen - 1;
                }
              }
              pcVar19 = (char *)((byte *)pcVar19 + 1);
            }
            uVar9 = 0;
            pbVar21 = (byte *)0x2bee85;
            goto LAB_001f7fbc;
          }
          pbVar21 = (byte *)fmt;
          if (bVar5 != 99) goto switchD_001f7c6a_caseD_70;
          uVar14 = (ulong)local_78;
          if (uVar14 < 0x29) {
            local_78 = local_78 + 8;
            puVar10 = (uint *)(uVar14 + (long)pvVar6);
          }
          else {
            puVar10 = puStack_70;
            puStack_70 = puStack_70 + 2;
          }
          local_58[0] = (byte)*puVar10;
          pbVar21 = (byte *)0x2bee85;
          goto LAB_001f8030;
        }
switchD_001f7c6a_caseD_70:
        pbVar20 = pbVar21;
        pbVar21 = (byte *)0x2bee85;
        pcVar19 = "%";
      }
      else {
        switch(bVar5) {
        case 0x6f:
          uVar9 = (ulong)local_78;
          if (uVar9 < 0x29) {
            local_78 = local_78 + 8;
            puVar10 = (uint *)(uVar9 + (long)pvVar6);
          }
          else {
            puVar10 = puStack_70;
            puStack_70 = puStack_70 + 2;
          }
          uVar9 = (ulong)*puVar10;
          pcVar19 = "%o";
          break;
        case 0x70:
        case 0x71:
        case 0x72:
        case 0x74:
        case 0x76:
        case 0x77:
          goto switchD_001f7c6a_caseD_70;
        case 0x73:
          uVar9 = (ulong)local_78;
          if (uVar9 < 0x29) {
            local_78 = local_78 + 8;
            puVar10 = (uint *)(uVar9 + (long)pvVar6);
          }
          else {
            puVar10 = puStack_70;
            puStack_70 = puStack_70 + 2;
          }
          pcVar19 = *(char **)puVar10;
          if ((byte *)pcVar19 == (byte *)0x0) {
            pcVar19 = "(null)";
          }
          if (*pcVar19 == 0) {
            uVar9 = 0;
          }
          else {
            uVar14 = 0;
            do {
              uVar9 = uVar14;
              if ((ulong)(long)(int)uVar11 <= uVar14 && uVar11 != 0xffffffff) break;
              uVar9 = uVar14 + 1;
              lVar13 = uVar14 + 1;
              uVar14 = uVar9;
            } while (((byte *)pcVar19)[lVar13] != 0);
          }
          bVar7 = false;
          iVar18 = (int)local_40;
          if (bVar1 == 0x7e) {
            iVar15 = iVar18 + -3;
            if (0xffffffc1 < iVar18 - 0x3dU) {
              iVar15 = 0x3c;
            }
            uVar14 = (ulong)iVar15;
            bVar7 = uVar14 < uVar9;
            if (uVar14 <= uVar9) {
              uVar9 = uVar14;
            }
          }
          if (((bVar3 == 0x2d) || (iVar18 == -1)) || (uVar14 = (ulong)iVar18, uVar14 <= uVar9)) {
            pbVar21 = (byte *)0x2bee85;
            goto LAB_001f81b7;
          }
          do {
            if (1 < buflen) {
              buflen = buflen - 1;
              *buf = 0x20;
              buf = (char *)((byte *)buf + 1);
            }
            uVar14 = uVar14 - 1;
            sVar17 = sVar17 + 1;
          } while (uVar9 < uVar14);
          pbVar21 = (byte *)0x2bee85;
          goto LAB_001f81a6;
        case 0x75:
          uVar9 = (ulong)local_78;
          if (uVar9 < 0x29) {
            local_78 = local_78 + 8;
            puVar10 = (uint *)(uVar9 + (long)pvVar6);
          }
          else {
            puVar10 = puStack_70;
            puStack_70 = puStack_70 + 2;
          }
          uVar9 = (ulong)*puVar10;
          pcVar19 = "%u";
          break;
        case 0x78:
          uVar9 = (ulong)local_78;
          if (uVar9 < 0x29) {
            local_78 = local_78 + 8;
            puVar10 = (uint *)(uVar9 + (long)pvVar6);
          }
          else {
            puVar10 = puStack_70;
            puStack_70 = puStack_70 + 2;
          }
          uVar9 = (ulong)*puVar10;
          pcVar19 = "%x";
          break;
        default:
          if (bVar5 != 100) {
            if (bVar5 != 0x6c) goto switchD_001f7c6a_caseD_70;
            bVar1 = pbVar20[1];
            pbVar20 = pbVar20 + 1;
            if (bVar1 < 0x75) {
              if (bVar1 == 100) {
                uVar9 = (ulong)local_78;
                if (uVar9 < 0x29) {
                  local_78 = local_78 + 8;
                  puVar10 = (uint *)(uVar9 + (long)pvVar6);
                }
                else {
                  puVar10 = puStack_70;
                  puStack_70 = puStack_70 + 2;
                }
                uVar16 = *(undefined8 *)puVar10;
                pcVar19 = "%ld";
              }
              else {
                if (bVar1 != 0x6f) goto switchD_001f7c6a_caseD_70;
                uVar9 = (ulong)local_78;
                if (uVar9 < 0x29) {
                  local_78 = local_78 + 8;
                  puVar10 = (uint *)(uVar9 + (long)pvVar6);
                }
                else {
                  puVar10 = puStack_70;
                  puStack_70 = puStack_70 + 2;
                }
                uVar16 = *(undefined8 *)puVar10;
                pcVar19 = "%lo";
              }
            }
            else if (bVar1 == 0x75) {
              uVar9 = (ulong)local_78;
              if (uVar9 < 0x29) {
                local_78 = local_78 + 8;
                puVar10 = (uint *)(uVar9 + (long)pvVar6);
              }
              else {
                puVar10 = puStack_70;
                puStack_70 = puStack_70 + 2;
              }
              uVar16 = *(undefined8 *)puVar10;
              pcVar19 = "%lu";
            }
            else {
              if (bVar1 != 0x78) goto switchD_001f7c6a_caseD_70;
              uVar9 = (ulong)local_78;
              if (uVar9 < 0x29) {
                local_78 = local_78 + 8;
                puVar10 = (uint *)(uVar9 + (long)pvVar6);
              }
              else {
                puVar10 = puStack_70;
                puStack_70 = puStack_70 + 2;
              }
              uVar16 = *(undefined8 *)puVar10;
              pcVar19 = "%lx";
            }
            sprintf((char *)local_58,pcVar19,uVar16);
            goto LAB_001f7f52;
          }
          uVar9 = (ulong)local_78;
          if (uVar9 < 0x29) {
            local_78 = local_78 + 8;
            puVar10 = (uint *)(uVar9 + (long)pvVar6);
          }
          else {
            puVar10 = puStack_70;
            puStack_70 = puStack_70 + 2;
          }
          local_38 = (ulong)*puVar10;
          sprintf((char *)local_58,"%d");
          if (pbVar20[1] == 0x74) {
            if (pbVar20[2] != 0x68) goto LAB_001f7f52;
            pbVar20 = pbVar20 + 2;
            if ((int)local_38 % 100 - 0x15U < 0xfffffff5) {
              iVar18 = (int)local_38 % 10;
              if (iVar18 == 3) {
                pbVar21 = (byte *)0x2c9e7b;
              }
              else if (iVar18 == 2) {
                pbVar21 = (byte *)0x2c0ba8;
              }
              else {
                if (iVar18 != 1) goto LAB_001f82ae;
                pbVar21 = (byte *)0x2c2bd6;
              }
            }
            else {
LAB_001f82ae:
              pbVar21 = (byte *)0x2ca04a;
            }
          }
          else {
            pbVar21 = (byte *)0x2bee85;
          }
          goto LAB_001f7f59;
        }
        sprintf((char *)local_58,pcVar19,uVar9);
LAB_001f7f52:
        pbVar21 = (byte *)0x2bee85;
LAB_001f7f59:
        uVar9 = strlen((char *)local_58);
        if (bVar3 == 0x2d) {
          pcVar19 = (char *)local_58;
LAB_001f7fbc:
          bVar7 = false;
        }
        else {
          bVar7 = false;
          if ((int)local_40 != -1) {
            uVar14 = (ulong)(int)local_40;
            pcVar19 = (char *)local_58;
            if (uVar9 < uVar14) {
              if (((bVar2 == 0x2b) && (local_58[0] != 0x2d)) && (sVar17 = sVar17 + 1, 1 < buflen)) {
                buflen = buflen - 1;
                *buf = 0x2b;
                buf = (char *)((byte *)buf + 1);
              }
              if ((bVar4 == 0x30) && (local_58[0] == 0x2d)) {
                if (1 < buflen) {
                  buflen = buflen - 1;
                  *buf = 0x2d;
                  buf = (char *)((byte *)buf + 1);
                }
                sVar17 = sVar17 + 1;
                uVar9 = uVar9 - 1;
                pcVar19 = (char *)(local_58 + 1);
              }
              if (uVar9 < uVar14) {
                do {
                  if (1 < buflen) {
                    buflen = buflen - 1;
                    *buf = ((char)bVar4 == 0x30) << 4 | 0x20;
                    buf = (char *)((byte *)buf + 1);
                  }
                  uVar14 = uVar14 - 1;
                  sVar17 = sVar17 + 1;
                } while (uVar9 < uVar14);
LAB_001f81a6:
                local_40 = uVar14;
              }
              goto LAB_001f81b7;
            }
          }
LAB_001f8030:
          pcVar19 = (char *)local_58;
          bVar7 = false;
        }
      }
LAB_001f81b7:
      if (uVar9 != 0) {
        sVar12 = 0;
        do {
          if (1 < buflen) {
            buflen = buflen - 1;
            *buf = ((byte *)pcVar19)[sVar12];
            buf = (char *)((byte *)buf + 1);
          }
          sVar12 = sVar12 + 1;
        } while (uVar9 != sVar12);
        sVar17 = sVar17 + uVar9;
      }
      bVar1 = *pbVar21;
      while (bVar1 != 0) {
        pbVar21 = pbVar21 + 1;
        if (1 < buflen) {
          buflen = buflen - 1;
          *buf = bVar1;
          buf = (char *)((byte *)buf + 1);
        }
        sVar17 = sVar17 + 1;
        bVar1 = *pbVar21;
      }
      if (bVar7) {
        lVar13 = -3;
        do {
          if (1 < buflen) {
            buflen = buflen - 1;
            *buf = 0x2e;
            buf = (char *)((byte *)buf + 1);
          }
          lVar13 = lVar13 + 1;
        } while (lVar13 != 0);
        sVar17 = sVar17 + 3;
        uVar9 = uVar9 + 3;
      }
      if (((bVar3 == 0x2d) && ((int)local_40 != -1)) &&
         (uVar14 = (ulong)(int)local_40, uVar9 < uVar14)) {
        lVar13 = sVar17 + uVar14;
        do {
          if (1 < buflen) {
            buflen = buflen - 1;
            *buf = 0x20;
            buf = (char *)((byte *)buf + 1);
          }
          uVar14 = uVar14 - 1;
        } while (uVar9 < uVar14);
        sVar17 = lVar13 - uVar9;
      }
    }
    else {
      if (bVar1 == 0) {
        if (buflen != 0) {
          *buf = 0;
        }
        return sVar17;
      }
      sVar17 = sVar17 + 1;
      pbVar20 = (byte *)fmt;
      if (1 < buflen) {
        buflen = buflen - 1;
        *buf = bVar1;
        buf = (char *)((byte *)buf + 1);
      }
    }
    fmt = (char *)(pbVar20 + 1);
  } while( true );
}

Assistant:

size_t t3vsprintf(char *buf, size_t buflen, const char *fmt, va_list args0)
{
    size_t rem;
    size_t need = 0;
    char *dst;

    /* 
     *   make a private copy of the arguments, to ensure that we don't modify
     *   the caller's copy (on some platforms, va_list is a reference type;
     *   the caller might want to reuse their argument pointer for a two-pass
     *   operation, such as a pre-format pass to measure how much space is
     *   needed) 
     */
    va_list args;
    os_va_copy(args, args0);

    /* scan the buffer */
    for (dst = buf, rem = buflen ; *fmt != '\0' ; ++fmt)
    {
        /* check for a format specifier */
        if (*fmt == '%')
        {
            const char *fmt_start = fmt;
            const char *nth = "";
            const char *txt;
            size_t txtlen;
            char buf[20];
            int fld_wid = -1;
            int fld_prec = -1;
            char lead_char = ' ';
            int plus = FALSE;
            int approx = FALSE;
            int add_ellipsis = FALSE;
            int left_align = FALSE;
            size_t i;

            /* skip the '%' */
            ++fmt;

            /* check for the "approximation" flag */
            if (*fmt == '~')
            {
                approx = TRUE;
                ++fmt;
            }

            /* check for an explicit sign */
            if (*fmt == '+')
            {
                plus = TRUE;
                ++fmt;
            }

            /* check for left alignment */
            if (*fmt == '-')
            {
                left_align = TRUE;
                ++fmt;
            }

            /* if leading zeros are desired, note it */
            if (*fmt == '0')
                lead_char = '0';

            /* check for a field width specifier */
            if (is_digit(*fmt))
            {
                /* scan the digits */
                for (fld_wid = 0 ; is_digit(*fmt) ; ++fmt)
                {
                    fld_wid *= 10;
                    fld_wid += value_of_digit(*fmt);
                }
            }
            else if (*fmt == '*')
            {
                /* the value is an integer taken from the arguments */
                fld_wid = va_arg(args, int);

                /* skip the '*' */
                ++fmt;
            }

            /* check for a precision specifier */
            if (*fmt == '.')
            {
                /* skip the '.' */
                ++fmt;

                /* check what we have */
                if (*fmt == '*')
                {
                    /* the value is an integer taken from the arguments */
                    fld_prec = va_arg(args, int);

                    /* skip the '*' */
                    ++fmt;
                }
                else
                {
                    /* scan the digits */
                    for (fld_prec = 0 ; is_digit(*fmt) ; ++fmt)
                    {
                        fld_prec *= 10;
                        fld_prec += value_of_digit(*fmt);
                    }
                }
            }
            
            /* check what follows */
            switch (*fmt)
            {
            case '%':
                /* it's a literal '%' */
                txt = "%";
                txtlen = 1;
                break;

            case 's':
                /* the value is a (char *) */
                txt = va_arg(args, char *);

                /* if it's null, show "(null)" */
                if (txt == 0)
                    txt = "(null)";

                /* get the length, limiting it to the precision */
                {
                    const char *p;

                    /* 
                     *   Scan until we reach a null terminator, or until our
                     *   length reaches the maximum given by the precision
                     *   qualifier.  
                     */
                    for (txtlen = 0, p = txt ;
                         *p != '\0' && (fld_prec == -1
                                        || txtlen < (size_t)fld_prec) ;
                         ++p, ++txtlen) ;
                }

                /* 
                 *   if the 'approximation' flag is specified, limit the
                 *   string to 60 characters or the field width, whichever
                 *   is less 
                 */
                if (approx)
                {
                    size_t lim;
                    
                    /* the default limit is 60 characters */
                    lim = 60;

                    /* 
                     *   if a field width is specified, it overrides the
                     *   default - but take out three characters for the
                     *   '...' suffix 
                     */
                    if (fld_wid != -1 && (size_t)fld_wid > lim)
                        lim = fld_wid - 3;

                    /* if we're over the limit, shorten the string */
                    if (txtlen > lim)
                    {
                        /* shorten the string to the limit */
                        txtlen = lim;

                        /* add an ellipsis to indicate the truncation */
                        add_ellipsis = TRUE;
                    }
                }

                /* 
                 *   if a field width was specified and we have the default
                 *   right alignment, pad to the left with spaces if the
                 *   width is greater than the actual length 
                 */
                if (fld_wid != -1 && !left_align)
                {
                    for ( ; (size_t)fld_wid > txtlen ; --fld_wid)
                    {
                        ++need;
                        if (rem > 1)
                            --rem, *dst++ = ' ';
                    }
                }
                break;

            case 'P':
                /* 
                 *   URL parameter - this is a (char*) value with url
                 *   encoding applied 
                 */
                txt = va_arg(args, char *);

                /* if it's null, use an empty string */
                if (txt == 0)
                    txt = "";

                /* use the field precision if given, or the string length */
                txtlen = (fld_prec >= 0 ? fld_prec : strlen(txt));

                /* encode the parameter and add it to the buffer */
                for ( ; txtlen != 0 ; --txtlen, ++txt)
                {
                    switch (*txt)
                    {
                    case '!':
                    case '*':
                    case '\'':
                    case '(':
                    case ')':
                    case ';':
                    case ':':
                    case '@':
                    case '&':
                    case '=':
                    case '+':
                    case '$':
                    case ',':
                    case '/':
                    case '?':
                    case '#':
                    case '[':
                    case ']':
                    case ' ':
                        /* use % encoding for special characters */
                        sprintf(buf, "%%%02x", (unsigned)(uchar)*txt);
                        need += 3;
                        for (i = 0 ; i < 3 ; ++i)
                        {
                            if (rem > 1)
                                *dst++ = buf[i], --rem;
                        }
                        break;

                    default:
                        /* copy anything else as-is */
                        need += 1;
                        if (rem > 1)
                            *dst++ = *txt, --rem;
                        break;
                    }
                }
                break;

            case 'c':
                /* the value is a (char) */
                buf[0] = (char)va_arg(args, int);
                txt = buf;
                txtlen = 1;
                break;

            case 'd':
                /* the value is an int, formatted in decimal */
                {
                    int ival = va_arg(args, int);
                    sprintf(buf, "%d", ival);

                    /* check for '%dth' notation (1st, 2nd, etc) */
                    nth = check_nth(fmt, ival);
                }
                /* fall through to num_common: */
                
            num_common:
                /* use the temporary buffer where we formatted the value */
                txt = buf;
                txtlen = strlen(buf);

                /* 
                 *   Pad with leading spaces or zeros if the requested
                 *   field width exceeds the actual size and we have the
                 *   default left alignment.  
                 */
                if (fld_wid != -1 && !left_align && (size_t)fld_wid > txtlen)
                {
                    /* 
                     *   if we're showing an explicit sign, and we don't have
                     *   a leading '-' in the results, add it 
                     */
                    if (plus && txt[0] != '-')
                    {
                        /* add the '+' at the start of the output */
                        ++need;
                        if (rem > 1)
                            --rem, *dst++ = '+';
                    }

                    /* 
                     *   if we're showing leading zeros, and we have a
                     *   negative number, show the '-' first 
                     */
                    if (lead_char == '0' && txt[0] == '-')
                    {
                        /* add the '-' at the start of the output */
                        ++need;
                        if (rem > 1)
                            --rem, *dst++ = '-';
                        
                        /* we've shown the '-', so skip it in the number */
                        ++txt;
                        --txtlen;
                    }

                    /* add the padding */
                    for ( ; (size_t)fld_wid > txtlen ; --fld_wid)
                    {
                        ++need;
                        if (rem > 1)
                            --rem, *dst++ = lead_char;
                    }
                }

                /* done */
                break;

            case 'u':
                /* the value is an int, formatted as unsigned decimal */
                sprintf(buf, "%u", va_arg(args, int));
                goto num_common;

            case 'x':
                /* the value is an int, formatted in hex */
                sprintf(buf, "%x", va_arg(args, int));
                goto num_common;

            case 'o':
                /* the value is an int, formatted in hex */
                sprintf(buf, "%o", va_arg(args, int));
                goto num_common;

            case 'l':
                /* it's a 'long' value - get the second specifier */
                switch (*++fmt)
                {
                case 'd':
                    /* it's a long, formatted in decimal */
                    sprintf(buf, "%ld", va_arg(args, long));
                    goto num_common;

                case 'u':
                    /* it's a long, formatted as unsigned decimal */
                    sprintf(buf, "%lu", va_arg(args, long));
                    goto num_common;

                case 'x':
                    /* it's a long, formatted in hex */
                    sprintf(buf, "%lx", va_arg(args, long));
                    goto num_common;

                case 'o':
                    /* it's a long, formatted in octal */
                    sprintf(buf, "%lo", va_arg(args, long));
                    goto num_common;

                default:
                    /* bad specifier - show the literal text */
                    txt = "%";
                    txtlen = 1;
                    fmt = fmt_start;
                    break;
                }
                break;

            default:
                /* bad specifier - show the literal text */
                txt = "%";
                txtlen = 1;
                fmt = fmt_start;
                break;
            }

            /* add the text to the buffer */
            for (i = txtlen ; i != 0 ; --i, ++txt)
            {
                ++need;
                if (rem > 1)
                    --rem, *dst++ = *txt;
            }

            /* add the 'nth' suffix, if applicable */
            for ( ; *nth != 0 ; ++nth)
            {
                ++need;
                if (rem > 1)
                    --rem, *dst++ = *nth;
            }

            /* add an ellipsis if desired */
            if (add_ellipsis)
            {
                /* add three '.' characters */
                for (i = 3 ; i != 0 ; --i)
                {
                    ++need;
                    if (rem > 1)
                        --rem, *dst++ = '.';
                }

                /* for padding purposes, count the ellipsis */
                txtlen += 3;
            }

            /* 
             *   if we have left alignment and the actual length is less
             *   than the field width, pad to the right with spaces 
             */
            if (left_align && fld_wid != -1 && (size_t)fld_wid > txtlen)
            {
                /* add spaces to pad out to the field width */
                for (i = fld_wid ; i > txtlen ; --i)
                {
                    ++need;
                    if (rem > 1)
                        --rem, *dst++ = ' ';
                }
            }
        }
        else
        {
            /* it's not a format specifier - just copy it literally */
            ++need;
            if (rem > 1)
                --rem, *dst++ = *fmt;
        }
    }

    /* add the trailing null */
    if (rem != 0)
        *dst = '\0';

    /* bracket the va_copy at the top of the function */
    os_va_copy_end(args);

    /* return the needed length */
    return need;
}